

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrs.c
# Opt level: O3

void cgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  singlecomplex *psVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  singlecomplex *Mxvec;
  singlecomplex *addr;
  ulong uVar14;
  long lVar15;
  singlecomplex *psVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong n;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  float fVar31;
  float fVar35;
  singlecomplex sVar32;
  singlecomplex sVar33;
  singlecomplex sVar34;
  float fVar36;
  ulong local_1e0;
  int ii;
  
  *info = 0;
  if (CONJ < trans) {
    ii = 1;
    iVar23 = -1;
LAB_00103530:
    *info = iVar23;
    input_error("cgstrs",&ii);
    return;
  }
  uVar3 = L->nrow;
  n = (ulong)uVar3;
  ii = 2;
  iVar23 = -2;
  if (((((int)uVar3 < 0) || (uVar3 != L->ncol)) || (L->Stype != SLU_SC)) ||
     ((L->Dtype != SLU_C || (L->Mtype != SLU_TRLU)))) goto LAB_00103530;
  ii = 3;
  iVar23 = -3;
  if (((U->nrow < 0) || ((U->nrow != U->ncol || (U->Stype != SLU_NC)))) ||
     ((U->Dtype != SLU_C || (U->Mtype != SLU_TRU)))) goto LAB_00103530;
  puVar6 = (uint *)B->Store;
  uVar28 = *puVar6;
  lVar21 = (long)(int)uVar28;
  ii = 6;
  iVar23 = -6;
  if (((((int)uVar28 < (int)uVar3) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_C)) ||
     (B->Mtype != SLU_GE)) goto LAB_00103530;
  uVar4 = B->ncol;
  uVar13 = (ulong)uVar4;
  Mxvec = singlecomplexCalloc((long)(int)uVar4 * n);
  if (Mxvec == (singlecomplex *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  addr = singlecomplexMalloc(n);
  if (addr == (singlecomplex *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  psVar7 = *(singlecomplex **)(puVar6 + 2);
  if (trans == NOTRANS) {
    pvVar8 = L->Store;
    lVar9 = *(long *)((long)pvVar8 + 8);
    pvVar10 = U->Store;
    lVar11 = *(long *)((long)pvVar10 + 8);
    if (0 < (int)uVar4) {
      uVar14 = 0;
      psVar16 = psVar7;
      do {
        if (uVar3 != 0) {
          uVar18 = 0;
          do {
            addr[perm_r[uVar18]] = psVar16[uVar18];
            uVar18 = uVar18 + 1;
          } while (n != uVar18);
          if (uVar3 != 0) {
            uVar18 = 0;
            do {
              psVar16[uVar18] = addr[uVar18];
              uVar18 = uVar18 + 1;
            } while (n != uVar18);
          }
        }
        uVar14 = uVar14 + 1;
        psVar16 = psVar16 + uVar28;
      } while (uVar14 != uVar13);
    }
    uVar14 = (ulong)*(uint *)((long)pvVar8 + 4);
    if ((int)*(uint *)((long)pvVar8 + 4) < 0) {
      fVar36 = 0.0;
    }
    else {
      fVar36 = 0.0;
      lVar15 = 0;
      do {
        lVar26 = (long)*(int *)(*(long *)((long)pvVar8 + 0x30) + lVar15 * 4);
        uVar28 = *(uint *)(*(long *)((long)pvVar8 + 0x20) + lVar26 * 4);
        iVar23 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4 + lVar26 * 4);
        iVar24 = iVar23 - uVar28;
        lVar22 = *(int *)(*(long *)((long)pvVar8 + 0x30) + 4 + lVar15 * 4) - lVar26;
        iVar20 = (int)lVar22;
        iVar25 = iVar24 - iVar20;
        if (iVar20 == 1) {
          if (0 < (int)uVar4) {
            lVar22 = lVar9 + 0xc + (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar26 * 4) * 8;
            uVar18 = 0;
            do {
              if ((int)(uVar28 + 1) < iVar23) {
                lVar27 = uVar18 * lVar21;
                lVar17 = *(long *)((long)pvVar8 + 0x18);
                lVar29 = 0;
                do {
                  lVar30 = (long)*(int *)(lVar17 + (long)(int)uVar28 * 4 + 4 + lVar29 * 4);
                  fVar31 = psVar7[lVar27 + lVar26].r;
                  fVar35 = psVar7[lVar27 + lVar26].i;
                  fVar1 = *(float *)(lVar22 + -4 + lVar29 * 8);
                  fVar2 = *(float *)(lVar22 + lVar29 * 8);
                  sVar32.r = psVar7[lVar27 + lVar30].r - (fVar1 * fVar31 + -fVar35 * fVar2);
                  sVar32.i = psVar7[lVar27 + lVar30].i - (fVar1 * fVar35 + fVar31 * fVar2);
                  psVar7[lVar27 + lVar30] = sVar32;
                  lVar29 = lVar29 + 1;
                } while (~uVar28 + iVar23 != (int)lVar29);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar13);
          }
        }
        else if (0 < (int)uVar4) {
          lVar17 = (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar26 * 4);
          uVar14 = 0;
          do {
            lVar27 = uVar14 * lVar21;
            clsolve(iVar24,iVar20,(singlecomplex *)(lVar9 + lVar17 * 8),psVar7 + lVar27 + lVar26);
            cmatvec(iVar24,iVar25,iVar20,(singlecomplex *)(lVar9 + (lVar22 + lVar17) * 8),
                    psVar7 + lVar27 + lVar26,Mxvec);
            if (0 < iVar25) {
              lVar29 = *(long *)((long)pvVar8 + 0x18);
              lVar30 = 0;
              do {
                lVar19 = (long)*(int *)(lVar29 + (long)(int)(uVar28 + iVar20) * 4 + lVar30 * 4);
                sVar33.r = psVar7[lVar27 + lVar19].r - Mxvec[lVar30].r;
                sVar33.i = psVar7[lVar27 + lVar19].i - Mxvec[lVar30].i;
                psVar7[lVar27 + lVar19] = sVar33;
                Mxvec[lVar30].r = 0.0;
                Mxvec[lVar30].i = 0.0;
                lVar30 = lVar30 + 1;
              } while (lVar30 < iVar25);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar13);
          uVar14 = (ulong)*(uint *)((long)pvVar8 + 4);
        }
        fVar36 = (float)(int)(uVar4 * 8 * iVar20 * iVar25) +
                 fVar36 + (float)(int)(uVar4 * 4 * iVar20 * (iVar20 + -1));
        bVar12 = lVar15 < (int)uVar14;
        lVar15 = lVar15 + 1;
      } while (bVar12);
      if (-1 < (int)uVar14) {
        do {
          iVar23 = *(int *)(*(long *)((long)pvVar8 + 0x30) + uVar14 * 4);
          lVar22 = (long)iVar23;
          iVar20 = *(int *)(*(long *)((long)pvVar8 + 0x30) + 4 + uVar14 * 4);
          iVar24 = iVar20 - iVar23;
          lVar15 = (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar22 * 4);
          fVar36 = (float)(int)(uVar4 * 4 * iVar24 * (iVar24 + 1)) + fVar36;
          if (iVar24 == 1) {
            if (0 < (int)uVar4) {
              psVar16 = psVar7 + lVar22;
              uVar18 = uVar13;
              do {
                c_div(psVar16,psVar16,(singlecomplex *)(lVar9 + lVar15 * 8));
                psVar16 = psVar16 + lVar21;
                uVar28 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar28;
              } while (uVar28 != 0);
LAB_00103c53:
              if (0 < (int)uVar4) {
                uVar18 = 0;
                do {
                  if (iVar23 < iVar20) {
                    lVar17 = uVar18 * lVar21;
                    lVar15 = *(long *)((long)pvVar10 + 0x18);
                    lVar26 = lVar22;
                    iVar24 = *(int *)(lVar15 + lVar22 * 4);
                    do {
                      iVar25 = *(int *)(lVar15 + 4 + lVar26 * 4);
                      if (iVar25 - iVar24 != 0 && iVar24 <= iVar25) {
                        lVar27 = *(long *)((long)pvVar10 + 0x10);
                        lVar29 = (long)iVar24;
                        do {
                          lVar30 = (long)*(int *)(lVar27 + lVar29 * 4);
                          fVar31 = psVar7[lVar17 + lVar26].r;
                          fVar35 = psVar7[lVar17 + lVar26].i;
                          fVar1 = *(float *)(lVar11 + lVar29 * 8);
                          fVar2 = *(float *)(lVar11 + 4 + lVar29 * 8);
                          sVar34.r = psVar7[lVar17 + lVar30].r - (fVar1 * fVar31 + -fVar35 * fVar2);
                          sVar34.i = psVar7[lVar17 + lVar30].i - (fVar1 * fVar35 + fVar31 * fVar2);
                          psVar7[lVar17 + lVar30] = sVar34;
                          lVar29 = lVar29 + 1;
                        } while (iVar25 != lVar29);
                      }
                      lVar26 = lVar26 + 1;
                      fVar36 = fVar36 + (float)((iVar25 - iVar24) * 8);
                      iVar24 = iVar25;
                    } while (lVar26 != iVar20);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar13);
              }
            }
          }
          else if (0 < (int)uVar4) {
            iVar25 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4 + lVar22 * 4);
            iVar5 = *(int *)(*(long *)((long)pvVar8 + 0x20) + lVar22 * 4);
            psVar16 = psVar7 + lVar22;
            uVar18 = uVar13;
            do {
              cusolve(iVar25 - iVar5,iVar24,(singlecomplex *)(lVar9 + lVar15 * 8),psVar16);
              psVar16 = psVar16 + lVar21;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
            goto LAB_00103c53;
          }
          bVar12 = 0 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar12);
      }
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      psVar16 = psVar7;
      do {
        if (0 < (int)uVar3) {
          uVar18 = 0;
          do {
            addr[uVar18] = psVar7[uVar14 * lVar21 + (long)perm_c[uVar18]];
            uVar18 = uVar18 + 1;
          } while (n != uVar18);
          if (0 < (int)uVar3) {
            uVar18 = 0;
            do {
              psVar16[uVar18] = addr[uVar18];
              uVar18 = uVar18 + 1;
            } while (n != uVar18);
          }
        }
        uVar14 = uVar14 + 1;
        psVar16 = psVar16 + lVar21;
      } while (uVar14 != uVar13);
    }
  }
  else {
    if (0 < (int)uVar4) {
      uVar14 = 0;
      psVar16 = psVar7;
      do {
        if (n != 0) {
          uVar18 = 0;
          do {
            addr[perm_c[uVar18]] = psVar16[uVar18];
            uVar18 = uVar18 + 1;
          } while (n != uVar18);
          if (n != 0) {
            uVar18 = 0;
            do {
              psVar16[uVar18] = addr[uVar18];
              uVar18 = uVar18 + 1;
            } while (n != uVar18);
          }
        }
        uVar14 = uVar14 + 1;
        psVar16 = psVar16 + uVar28;
      } while (uVar14 != uVar13);
      stat->ops[0x11] = 0.0;
      local_1e0 = uVar13;
      if (trans == TRANS) {
        psVar16 = psVar7;
        if ((int)uVar4 < 1) goto LAB_00103eef;
        do {
          sp_ctrsv("U","T","N",L,U,psVar16,stat,info);
          sp_ctrsv("L","T","U",L,U,psVar16,stat,info);
          local_1e0 = local_1e0 - 1;
          psVar16 = psVar16 + lVar21;
        } while (local_1e0 != 0);
      }
      else {
        psVar16 = psVar7;
        if ((int)uVar4 < 1) goto LAB_00103eef;
        do {
          sp_ctrsv("U","C","N",L,U,psVar16,stat,info);
          sp_ctrsv("L","C","U",L,U,psVar16,stat,info);
          local_1e0 = local_1e0 - 1;
          psVar16 = psVar16 + lVar21;
        } while (local_1e0 != 0);
      }
      if (0 < (int)uVar4) {
        uVar14 = 0;
        psVar16 = psVar7;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            do {
              addr[uVar18] = psVar7[uVar14 * lVar21 + (long)perm_r[uVar18]];
              uVar18 = uVar18 + 1;
            } while (n != uVar18);
            if (0 < (int)uVar3) {
              uVar18 = 0;
              do {
                psVar16[uVar18] = addr[uVar18];
                uVar18 = uVar18 + 1;
              } while (n != uVar18);
            }
          }
          uVar14 = uVar14 + 1;
          psVar16 = psVar16 + lVar21;
        } while (uVar14 != uVar13);
      }
      goto LAB_00103eef;
    }
    fVar36 = 0.0;
  }
  stat->ops[0x11] = fVar36;
LAB_00103eef:
  superlu_free(Mxvec);
  superlu_free(addr);
  return;
}

Assistant:

void
cgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    singlecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex   *work_col;
#endif
    singlecomplex   temp_comp;
    DNformat *Bstore;
    singlecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    singlecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void cprint_soln(int n, int nrhs, const singlecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("cgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = singlecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = singlecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ctrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		cgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    clsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    cmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    c_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ctrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    cusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			cc_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ctrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ctrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ctrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ctrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}